

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O0

json * __thiscall
cfd::js::api::json::
ExecuteElementsCheckApi<cfd::js::api::json::AddTaprootSchnorrSignRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::AddTaprootSchnorrSignRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *bitcoin_function,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
          *elements_function)

{
  ErrorResponse local_800;
  JsonClassBase<cfd::js::api::json::ErrorResponseBase> local_748 [4];
  JsonClassBase<cfd::js::api::json::RawTransactionResponse> local_728 [4];
  undefined1 local_708 [8];
  RawTransactionResponse res_2;
  RawTransactionResponseStruct local_6a8;
  RawTransactionResponseStruct local_5e0;
  undefined1 local_518 [8];
  RawTransactionResponseStruct response;
  AddTaprootSchnorrSignRequestStruct request;
  ErrorResponse res_1;
  CfdException *cfd_except;
  ErrorResponse res;
  CfdException ex;
  undefined1 local_150 [8];
  AddTaprootSchnorrSignRequest req;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
  *elements_function_local;
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
  *bitcoin_function_local;
  string *request_message_local;
  string *json_message;
  
  req.txin_._192_8_ = elements_function;
  AddTaprootSchnorrSignRequest::AddTaprootSchnorrSignRequest
            ((AddTaprootSchnorrSignRequest *)local_150);
  core::JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest>::Deserialize
            ((JsonClassBase<cfd::js::api::json::AddTaprootSchnorrSignRequest> *)local_150,
             request_message);
  AddTaprootSchnorrSignRequest::ConvertToStruct
            ((AddTaprootSchnorrSignRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (AddTaprootSchnorrSignRequest *)local_150);
  RawTransactionResponseStruct::RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_518);
  if (((byte)response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count & 1) == 0) {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
    ::operator()(&local_6a8,bitcoin_function,
                 (AddTaprootSchnorrSignRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_518,&local_6a8);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_6a8);
  }
  else {
    std::
    function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::AddTaprootSchnorrSignRequestStruct_&)>
    ::operator()(&local_5e0,elements_function,
                 (AddTaprootSchnorrSignRequestStruct *)
                 &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
    RawTransactionResponseStruct::operator=((RawTransactionResponseStruct *)local_518,&local_5e0);
    RawTransactionResponseStruct::~RawTransactionResponseStruct(&local_5e0);
  }
  res_2._87_1_ = 0;
  std::__cxx11::string::string((string *)this);
  if (response._24_4_ == 0) {
    RawTransactionResponse::RawTransactionResponse((RawTransactionResponse *)local_708);
    RawTransactionResponse::ConvertFromStruct
              ((RawTransactionResponse *)local_708,(RawTransactionResponseStruct *)local_518);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_(local_728)
    ;
    std::__cxx11::string::operator=((string *)this,(string *)local_728);
    std::__cxx11::string::~string((string *)local_728);
    RawTransactionResponse::~RawTransactionResponse((RawTransactionResponse *)local_708);
  }
  else {
    ErrorResponse::ConvertFromStruct(&local_800,(InnerErrorResponseStruct *)&response.field_0x18);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_(local_748);
    std::__cxx11::string::operator=((string *)this,(string *)local_748);
    std::__cxx11::string::~string((string *)local_748);
    ErrorResponse::~ErrorResponse(&local_800);
  }
  res_2._87_1_ = 1;
  RawTransactionResponseStruct::~RawTransactionResponseStruct
            ((RawTransactionResponseStruct *)local_518);
  AddTaprootSchnorrSignRequestStruct::~AddTaprootSchnorrSignRequestStruct
            ((AddTaprootSchnorrSignRequestStruct *)
             &response.ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count);
  AddTaprootSchnorrSignRequest::~AddTaprootSchnorrSignRequest
            ((AddTaprootSchnorrSignRequest *)local_150);
  return this;
}

Assistant:

std::string ExecuteElementsCheckApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        bitcoin_function,  // NOLINT
    std::function<ResponseStructType(const RequestStructType &)>
        elements_function) {  // NOLINT
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response;
  if (request.is_elements) {
#ifndef CFD_DISABLE_ELEMENTS
    response = elements_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_ELEMENTS
  } else {
#ifndef CFD_DISABLE_BITCOIN
    response = bitcoin_function(request);
#else
    CfdException ex(
        CfdError::kCfdIllegalArgumentError, "functionType not supported.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
#endif  // CFD_DISABLE_BITCOIN
  }
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}